

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::GetProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  JavascriptString *originalInstance_00;
  Var instance_00;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  propertyRecord = (PropertyRecord *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x2cc,"(requestContext)","requestContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = DynamicObject::HasObjectArray((DynamicObject *)originalInstance_local);
  if (bVar2) {
    ScriptContext::GetOrAddPropertyRecord(requestContext,(JavascriptString *)value_local,&local_48);
  }
  else {
    ScriptContext::FindPropertyRecord(requestContext,(JavascriptString *)value_local,&local_48);
    if (local_48 == (PropertyRecord *)0x0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      info_local->m_instance = pRVar5;
      return 0;
    }
  }
  instance_00 = originalInstance_local;
  originalInstance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId(local_48);
  BVar3 = GetProperty(this,(DynamicObject *)instance_00,originalInstance_00,propertyId,
                      &info_local->m_instance,(PropertyValueInfo *)propertyRecord,requestContext);
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerBase::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Consider: Implement actual string hash lookup
        Assert(requestContext);
        PropertyRecord const* propertyRecord;

        if (instance->HasObjectArray())
        {
            requestContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        }
        else
        {
            requestContext->FindPropertyRecord(propertyNameString, &propertyRecord);
            if (propertyRecord == nullptr)
            {
                *value = requestContext->GetMissingPropertyResult();
                return false;
            }
        }
        return PathTypeHandlerBase::GetProperty(instance, originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }